

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STEPFile.h
# Opt level: O0

void __thiscall
Assimp::STEP::InternGenericConvertList<Assimp::STEP::EXPRESS::PrimitiveDataType<double>,_2UL,_3UL>::
operator()(InternGenericConvertList<Assimp::STEP::EXPRESS::PrimitiveDataType<double>,_2UL,_3UL>
           *this,ListOf<Assimp::STEP::EXPRESS::PrimitiveDataType<double>,_2UL,_3UL> *out,
          shared_ptr<const_Assimp::STEP::EXPRESS::DataType> *inp_base,DB *db)

{
  pointer psVar1;
  shared_ptr<const_Assimp::STEP::EXPRESS::DataType> *this_00;
  element_type *peVar2;
  TypeError *this_01;
  size_t sVar3;
  Logger *pLVar4;
  pointer psVar5;
  reference a;
  LIST *local_e8;
  TypeError *t;
  pointer local_78;
  pointer local_70;
  size_t i;
  allocator local_51;
  string local_50;
  LIST *local_30;
  LIST *inp;
  DB *db_local;
  shared_ptr<const_Assimp::STEP::EXPRESS::DataType> *inp_base_local;
  ListOf<Assimp::STEP::EXPRESS::PrimitiveDataType<double>,_2UL,_3UL> *out_local;
  InternGenericConvertList<Assimp::STEP::EXPRESS::PrimitiveDataType<double>,_2UL,_3UL> *this_local;
  
  inp = (LIST *)db;
  db_local = (DB *)inp_base;
  inp_base_local = (shared_ptr<const_Assimp::STEP::EXPRESS::DataType> *)out;
  out_local = (ListOf<Assimp::STEP::EXPRESS::PrimitiveDataType<double>,_2UL,_3UL> *)this;
  peVar2 = std::__shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>::get
                     (&inp_base->
                       super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>
                     );
  if (peVar2 == (element_type *)0x0) {
    local_e8 = (LIST *)0x0;
  }
  else {
    local_e8 = (LIST *)__dynamic_cast(peVar2,&EXPRESS::DataType::typeinfo,&EXPRESS::LIST::typeinfo,0
                                     );
  }
  local_30 = local_e8;
  if (local_e8 != (LIST *)0x0) {
    sVar3 = EXPRESS::LIST::GetSize(local_e8);
    if (sVar3 < 4) {
      sVar3 = EXPRESS::LIST::GetSize(local_30);
      if (sVar3 < 2) {
        pLVar4 = DefaultLogger::get();
        Logger::warn(pLVar4,"too few aggregate elements");
      }
    }
    else {
      pLVar4 = DefaultLogger::get();
      Logger::warn(pLVar4,"too many aggregate elements");
    }
    this_00 = inp_base_local;
    sVar3 = EXPRESS::LIST::GetSize(local_30);
    std::vector<double,_std::allocator<double>_>::reserve
              ((vector<double,_std::allocator<double>_> *)this_00,sVar3);
    for (local_70 = (pointer)0x0; psVar1 = local_70,
        psVar5 = (pointer)EXPRESS::LIST::GetSize(local_30), psVar1 < psVar5;
        local_70 = (pointer)((long)&(local_70->
                                    super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>
                                    )._M_ptr + 1)) {
      local_78 = (pointer)0x0;
      std::vector<double,_std::allocator<double>_>::push_back
                ((vector<double,_std::allocator<double>_> *)inp_base_local,
                 (value_type_conflict5 *)&local_78);
      a = std::vector<double,_std::allocator<double>_>::back
                    ((vector<double,_std::allocator<double>_> *)inp_base_local);
      EXPRESS::LIST::operator[]((LIST *)&t,(size_t)local_30);
      GenericConvert<double>(a,(shared_ptr<const_Assimp::STEP::EXPRESS::DataType> *)&t,(DB *)inp);
      std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>::~shared_ptr
                ((shared_ptr<const_Assimp::STEP::EXPRESS::DataType> *)&t);
    }
    return;
  }
  i._3_1_ = 1;
  this_01 = (TypeError *)__cxa_allocate_exception(0x10);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_50,"type error reading aggregate",&local_51);
  TypeError::TypeError(this_01,&local_50,0xffffffffffffffff,0xffffffffffffffff);
  i._3_1_ = 0;
  __cxa_throw(this_01,&TypeError::typeinfo,TypeError::~TypeError);
}

Assistant:

void operator()(ListOf<T, min_cnt, max_cnt>& out, const std::shared_ptr< const EXPRESS::DataType >& inp_base, const STEP::DB& db) {

            const EXPRESS::LIST* inp = dynamic_cast<const EXPRESS::LIST*>(inp_base.get());
            if (!inp) {
                throw TypeError("type error reading aggregate");
            }

            // XXX is this really how the EXPRESS notation ([?:3],[1:3]) is intended?
            if (max_cnt && inp->GetSize() > max_cnt) {
                ASSIMP_LOG_WARN("too many aggregate elements");
            }
            else if (inp->GetSize() < min_cnt) {
                ASSIMP_LOG_WARN("too few aggregate elements");
            }

            out.reserve(inp->GetSize());
            for(size_t i = 0; i < inp->GetSize(); ++i) {

                out.push_back( typename ListOf<T, min_cnt, max_cnt>::OutScalar() );
                try{
                    GenericConvert(out.back(),(*inp)[i], db);
                }
                catch(const TypeError& t) {
                    throw TypeError(t.what() +std::string(" of aggregate"));
                }
            }
        }